

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

error_code pstore::exchange::import_ns::fragment_sections::check_fragment(fragment *f)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  error_category *peVar6;
  debug_line_section *pdVar7;
  generic_section *s;
  byte *pbVar8;
  error_category *peVar9;
  error e;
  long lVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  container<unsigned_char> cVar14;
  error_code eVar15;
  
  peVar6 = (error_category *)std::_V2::system_category();
  uVar12 = (f->arr_).sa_.bitmap_;
  uVar4 = 0;
  if ((ulong)uVar12 == 0) {
    uVar3 = 0;
    uVar13 = 0;
  }
  else {
    uVar3 = bit_count::ctz((ulong)uVar12);
    uVar13 = (ulong)(uVar12 >> ((byte)uVar3 & 0x1f));
  }
  peVar9 = peVar6;
  if ((int)uVar13 != 0) {
    uVar4 = 0;
    do {
      switch(uVar3 & 0xff) {
      case 0:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)0,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 1:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)1,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 2:
        repo::fragment::
        at_impl<(pstore::repo::section_kind)2,pstore::repo::fragment_const&,pstore::repo::bss_section_const>
                  (f);
        e = none;
        goto LAB_001c6539;
      case 3:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)3,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 4:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)4,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 5:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)5,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 6:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)6,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 7:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)7,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 8:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)8,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 9:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)9,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 10:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)10,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0xb:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)11,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0xc:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)12,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0xd:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)13,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0xe:
        pdVar7 = repo::fragment::
                 at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                           (f);
        cVar14 = repo::generic_section::payload(&pdVar7->g_);
        pbVar8 = (byte *)((ulong)(cVar14.end_ + 7) & 0xfffffffffffffff8);
        uVar2 = (ulong)((pdVar7->g_).field_0.field32_ >> 5 & 0xfffffff8) * 3;
        pbVar1 = pbVar8 + uVar2;
        lVar10 = (long)((uVar2 >> 3) * -0x5555555555555555) >> 2;
        pbVar11 = pbVar8;
        if (0 < lVar10) {
          uVar12 = (f->arr_).sa_.bitmap_;
          pbVar11 = pbVar8 + lVar10 * 0x60;
          lVar10 = lVar10 + 1;
          pbVar8 = pbVar8 + 0x30;
          do {
            if ((0x1f < pbVar8[-0x30]) || ((1 << (pbVar8[-0x30] & 0x1f) & uVar12) == 0)) {
              pbVar8 = pbVar8 + -0x30;
              goto LAB_001c6529;
            }
            if ((0x1f < pbVar8[-0x18]) || ((1 << (pbVar8[-0x18] & 0x1f) & uVar12) == 0)) {
              pbVar8 = pbVar8 + -0x18;
              goto LAB_001c6529;
            }
            if ((0x1f < *pbVar8) || ((1 << (*pbVar8 & 0x1f) & uVar12) == 0)) goto LAB_001c6529;
            if ((0x1f < pbVar8[0x18]) || ((1 << (pbVar8[0x18] & 0x1f) & uVar12) == 0)) {
              pbVar8 = pbVar8 + 0x18;
              goto LAB_001c6529;
            }
            lVar10 = lVar10 + -1;
            pbVar8 = pbVar8 + 0x60;
          } while (1 < lVar10);
        }
        lVar10 = ((long)pbVar1 - (long)pbVar11 >> 3) * -0x5555555555555555;
        if (lVar10 == 1) {
LAB_001c63f3:
          pbVar8 = pbVar11;
          if ((*pbVar11 < 0x20) && ((1 << (*pbVar11 & 0x1f) & (f->arr_).sa_.bitmap_) != 0)) {
            pbVar8 = pbVar1;
          }
        }
        else if (lVar10 == 2) {
LAB_001c63d4:
          pbVar8 = pbVar11;
          if ((*pbVar11 < 0x20) && ((1 << (*pbVar11 & 0x1f) & (f->arr_).sa_.bitmap_) != 0)) {
            pbVar11 = pbVar11 + 0x18;
            goto LAB_001c63f3;
          }
        }
        else {
          pbVar8 = pbVar1;
          if (((lVar10 == 3) && (pbVar8 = pbVar11, *pbVar11 < 0x20)) &&
             ((1 << (*pbVar11 & 0x1f) & (f->arr_).sa_.bitmap_) != 0)) {
            pbVar11 = pbVar11 + 0x18;
            goto LAB_001c63d4;
          }
        }
LAB_001c6529:
        e = internal_fixup_target_not_found;
        if (pbVar8 == pbVar1) {
          e = none;
        }
LAB_001c6539:
        eVar15 = make_error_code(e);
        goto LAB_001c64da;
      case 0xf:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)15,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0x10:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)16,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0x11:
        s = repo::fragment::
            at_impl<(pstore::repo::section_kind)17,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                      (f);
        break;
      case 0x12:
        repo::fragment::
        at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                  (f);
        uVar4 = 0;
        peVar9 = peVar6;
        goto switchD_001c6283_default;
      case 0x13:
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                      ,0x99);
      default:
        goto switchD_001c6283_default;
      }
      eVar15 = anon_unknown.dwarf_73da7a::validate_section_ifixups<pstore::repo::generic_section>
                         (f,s);
LAB_001c64da:
      peVar9 = eVar15._M_cat;
      uVar4 = eVar15._M_value;
switchD_001c6283_default:
      uVar12 = (uint)(uVar13 >> 1);
      uVar3 = uVar3 + 1;
      if (1 < (uint)uVar13) {
        uVar5 = bit_count::ctz(uVar13 >> 1);
        uVar12 = uVar12 >> ((byte)uVar5 & 0x1f);
        uVar3 = uVar3 + uVar5;
      }
      uVar13 = (ulong)uVar12;
    } while ((uVar12 != 0) && (uVar4 == 0));
  }
  eVar15._4_4_ = 0;
  eVar15._M_value = uVar4;
  eVar15._M_cat = peVar9;
  return eVar15;
}

Assistant:

std::error_code fragment_sections::check_fragment (repo::fragment const & f) {
                std::error_code error;
                for (auto it = f.begin (), end = f.end (); it != end && !error; ++it) {
                    repo::section_kind const kind = *it;
#define X(k)                                                                                       \
    case repo::section_kind::k:                                                                    \
        error = validate_section_ifixups (f, f.at<repo::section_kind::k> ());                      \
        break;
                    switch (kind) {
                        PSTORE_MCREPO_SECTION_KINDS
                    case repo::section_kind::last:
                        PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about the assert macro)
                        break;
                    }
#undef X
                }
                return error;
            }